

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

void duckdb::SetNumericValueInternal
               (Value *input,LogicalType *type,NumericValueUnion *val,bool *has_val)

{
  PhysicalType PVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  InternalException *pIVar6;
  float fVar7;
  double dVar8;
  uhugeint_t uVar9;
  allocator local_39;
  string local_38;
  
  if (input->is_null == true) {
    *has_val = false;
    return;
  }
  PVar1 = (input->type_).physical_type_;
  if (PVar1 != type->physical_type_) {
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,
               "SetMin or SetMax called with Value that does not match statistics\' column value",
               &local_39);
    InternalException::InternalException(pIVar6,&local_38);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  *has_val = true;
  switch(PVar1) {
  case BOOL:
    uVar2 = BooleanValue::Get(input);
    goto LAB_01537603;
  case UINT8:
    uVar2 = UTinyIntValue::Get(input);
    goto LAB_01537603;
  case INT8:
    uVar2 = TinyIntValue::Get(input);
LAB_01537603:
    (val->value_).tinyint = uVar2;
    break;
  case UINT16:
    uVar3 = USmallIntValue::Get(input);
    goto LAB_015375e7;
  case INT16:
    uVar3 = SmallIntValue::Get(input);
LAB_015375e7:
    (val->value_).smallint = uVar3;
    break;
  case UINT32:
    uVar4 = UIntegerValue::Get(input);
    goto LAB_0153760f;
  case INT32:
    uVar4 = IntegerValue::Get(input);
LAB_0153760f:
    (val->value_).integer = uVar4;
    break;
  case UINT64:
    uVar5 = UBigIntValue::Get(input);
    goto LAB_01537630;
  case INT64:
    uVar5 = BigIntValue::Get(input);
LAB_01537630:
    (val->value_).bigint = uVar5;
    break;
  case UINT64|UINT8:
switchD_015375b2_caseD_a:
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unsupported type for NumericStatistics::SetValueInternal",
               &local_39);
    InternalException::InternalException(pIVar6,&local_38);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    fVar7 = FloatValue::Get(input);
    (val->value_).float_ = fVar7;
    break;
  case DOUBLE:
    dVar8 = DoubleValue::Get(input);
    (val->value_).double_ = dVar8;
    break;
  default:
    if (PVar1 == UINT128) {
      uVar9 = UhugeIntValue::Get(input);
    }
    else {
      if (PVar1 != INT128) goto switchD_015375b2_caseD_a;
      uVar9 = (uhugeint_t)HugeIntValue::Get(input);
    }
    *(uint64_t *)&val->value_ = uVar9.lower;
    *(uint64_t *)((long)&val->value_ + 8) = uVar9.upper;
  }
  return;
}

Assistant:

void SetNumericValueInternal(const Value &input, const LogicalType &type, NumericValueUnion &val, bool &has_val) {
	if (input.IsNull()) {
		has_val = false;
		return;
	}
	if (input.type().InternalType() != type.InternalType()) {
		throw InternalException("SetMin or SetMax called with Value that does not match statistics' column value");
	}
	has_val = true;
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		val.value_.boolean = BooleanValue::Get(input);
		break;
	case PhysicalType::INT8:
		val.value_.tinyint = TinyIntValue::Get(input);
		break;
	case PhysicalType::INT16:
		val.value_.smallint = SmallIntValue::Get(input);
		break;
	case PhysicalType::INT32:
		val.value_.integer = IntegerValue::Get(input);
		break;
	case PhysicalType::INT64:
		val.value_.bigint = BigIntValue::Get(input);
		break;
	case PhysicalType::UINT8:
		val.value_.utinyint = UTinyIntValue::Get(input);
		break;
	case PhysicalType::UINT16:
		val.value_.usmallint = USmallIntValue::Get(input);
		break;
	case PhysicalType::UINT32:
		val.value_.uinteger = UIntegerValue::Get(input);
		break;
	case PhysicalType::UINT64:
		val.value_.ubigint = UBigIntValue::Get(input);
		break;
	case PhysicalType::INT128:
		val.value_.hugeint = HugeIntValue::Get(input);
		break;
	case PhysicalType::UINT128:
		val.value_.uhugeint = UhugeIntValue::Get(input);
		break;
	case PhysicalType::FLOAT:
		val.value_.float_ = FloatValue::Get(input);
		break;
	case PhysicalType::DOUBLE:
		val.value_.double_ = DoubleValue::Get(input);
		break;
	default:
		throw InternalException("Unsupported type for NumericStatistics::SetValueInternal");
	}
}